

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  parasail_matrix_t *ppVar1;
  void *pvVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  longlong lVar11;
  longlong lVar12;
  int6 iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  __m128i *palVar31;
  __m128i *palVar32;
  __m128i *palVar33;
  int a;
  int iVar34;
  int iVar35;
  __m128i *b;
  __m128i *ptr;
  __m128i *palVar36;
  uint uVar37;
  int iVar38;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  __m128i *palVar39;
  undefined4 in_register_00000084;
  longlong lVar40;
  longlong in_R9;
  ushort uVar41;
  ushort uVar46;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  ushort uVar44;
  ushort uVar45;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar42 [16];
  ushort uVar50;
  longlong extraout_XMM0_Qb;
  undefined1 auVar43 [16];
  longlong extraout_XMM0_Qb_00;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  __m128i alVar51;
  __m128i alVar52;
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i vCompare;
  __m128i vT_5;
  __m128i cond_4;
  __m128i vEa_ext_1;
  __m128i vEa_1;
  __m128i vT_4;
  __m128i cond_3;
  __m128i vTAll_3;
  __m128i cond_2;
  __m128i case2_1;
  __m128i case1_1;
  __m128i vT_3;
  __m128i vTAll_2;
  __m128i vHp;
  __m128i vT_2;
  __m128i cond_1;
  __m128i vTAll_1;
  __m128i vT_1;
  __m128i cond;
  __m128i vEa_ext;
  __m128i vEa;
  __m128i vT;
  __m128i case2;
  __m128i case1;
  __m128i cond_zero;
  __m128i vTAll;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *tmp_1;
  __m128i *tmp;
  __m128i *vP;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFa_ext;
  __m128i vFa;
  __m128i vF_ext;
  __m128i vF;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  __m128i vFTMask;
  __m128i vTMask;
  __m128i vTDelF;
  __m128i vTDiagF;
  __m128i vTInsE;
  __m128i vTDiagE;
  __m128i vTDiag;
  __m128i vTDel;
  __m128i vTIns;
  __m128i vTZero;
  parasail_result_t *result;
  undefined8 uStack_9c8;
  int16_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  int16_t local_99a;
  int16_t score;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvHMax;
  __m128i *pvHT;
  __m128i *pvEaLoad;
  __m128i *pvEaStore;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_910;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  short local_668;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short sStack_660;
  short sStack_65e;
  short sStack_65c;
  short sStack_65a;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  short local_608;
  short sStack_606;
  short sStack_604;
  short sStack_602;
  short sStack_600;
  short sStack_5fe;
  short sStack_5fc;
  short sStack_5fa;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short local_5e8;
  short sStack_5e6;
  short sStack_5e4;
  short sStack_5e2;
  short sStack_5e0;
  short sStack_5de;
  short sStack_5dc;
  short sStack_5da;
  short local_5c8;
  short sStack_5c6;
  short sStack_5c4;
  short sStack_5c2;
  short sStack_5c0;
  short sStack_5be;
  short sStack_5bc;
  short sStack_5ba;
  short local_5a8;
  short sStack_5a6;
  short sStack_5a4;
  short sStack_5a2;
  short sStack_5a0;
  short sStack_59e;
  short sStack_59c;
  short sStack_59a;
  short local_578;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_570;
  short sStack_56e;
  short sStack_56c;
  short sStack_56a;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  size_t len;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  
  lVar40 = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace_striped_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace_striped_profile_sse2_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace_striped_profile_sse2_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace_striped_profile_sse2_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_910 = 0;
    iVar35 = profile->s1Len;
    ppVar1 = profile->matrix;
    a = (iVar35 + 7) / 8;
    pvVar2 = (profile->profile16).score;
    i._0_2_ = (short)open;
    uVar27 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar28 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (undefined2)gap;
    uVar29 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar30 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    local_99a = -0x8000;
    vMaxHUnit[1] = 0;
    vMaxH[0] = 0;
    uStack_9c8 = 0;
    vMaxHUnit[0] = 0;
    iVar34 = ppVar1->max;
    profile_local = (parasail_profile_t *)parasail_result_new_trace(a,s2Len,0x10,0x10);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      uVar37 = *(uint *)&profile_local->field_0xc | 0x8280804;
      len = (size_t)uVar37;
      *(uint *)&profile_local->field_0xc = uVar37;
      pvHLoad = parasail_memalign___m128i(0x10,(long)a);
      pvE = parasail_memalign___m128i(0x10,(long)a);
      b = parasail_memalign___m128i(0x10,(long)a);
      pvEaLoad = parasail_memalign___m128i(0x10,(long)a);
      pvHT = parasail_memalign___m128i(0x10,(long)a);
      ptr = parasail_memalign___m128i(0x10,(long)a);
      vGapO[1] = (longlong)parasail_memalign___m128i(0x10,(long)a);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvEaLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHT == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if ((__m128i *)vGapO[1] == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar52[0] = (long)a;
        alVar52[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,alVar52,len);
        alVar51[0] = (long)a;
        alVar51[1] = extraout_RDX_00;
        parasail_memset___m128i(b,alVar51,len);
        c[0] = (long)a;
        c[1] = extraout_RDX_01;
        palVar39 = pvEaLoad;
        parasail_memset___m128i(pvEaLoad,c,len);
        for (k = 0; k < a; k = k + 1) {
          palVar39 = (__m128i *)
                     ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                     rowcols->score_row;
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = a;
          vH_00[1]._4_4_ = 0;
          arr_store(palVar39,vH_00,0,(int32_t)lVar40,(int32_t)in_R9);
        }
        for (end_query = 0; palVar33 = pvHLoad, palVar32 = pvEaLoad, palVar31 = pvHT,
            lVar11 = vGapO[1], end_query < s2Len; end_query = end_query + 1) {
          auVar42._8_8_ = uVar28;
          auVar42._0_8_ = uVar27;
          register0x00001200 = psubsw(ZEXT816(0),auVar42);
          vH_05[0] = pvHLoad[a + -1][0];
          vH_dag[1] = vH_05[0] << 0x10;
          vH[0] = pvHLoad[a + -1][1] << 0x10 | vH_05[0] >> 0x30;
          vH_05[0] = (ulong)end_query;
          iVar38 = ppVar1->mapper[(byte)s2[vH_05[0]]] * a;
          if (local_910 == end_query + -2) {
            vGapO[1] = (longlong)pvE;
            pvHLoad = (__m128i *)lVar11;
          }
          else {
            pvHLoad = pvE;
          }
          pvE = palVar33;
          pvEaLoad = pvHT;
          pvHT = palVar32;
          k = 0;
          while( true ) {
            if (a <= k) break;
            palVar39 = b + k;
            lVar11 = (*palVar39)[0];
            lVar12 = (*palVar39)[1];
            alVar52 = *palVar39;
            auVar24._8_8_ = vH[0];
            auVar24._0_8_ = vH_dag[1];
            auVar42 = paddsw(auVar24,*(undefined1 (*) [16])
                                      ((long)pvVar2 + (long)k * 0x10 + (long)iVar38 * 0x10));
            local_578 = auVar42._0_2_;
            sStack_576 = auVar42._2_2_;
            sStack_574 = auVar42._4_2_;
            sStack_572 = auVar42._6_2_;
            sStack_570 = auVar42._8_2_;
            sStack_56e = auVar42._10_2_;
            sStack_56c = auVar42._12_2_;
            sStack_56a = auVar42._14_2_;
            local_578 = (ushort)(-1 < local_578) * local_578;
            sStack_576 = (ushort)(-1 < sStack_576) * sStack_576;
            sStack_574 = (ushort)(-1 < sStack_574) * sStack_574;
            sStack_572 = (ushort)(-1 < sStack_572) * sStack_572;
            sStack_570 = (ushort)(-1 < sStack_570) * sStack_570;
            sStack_56e = (ushort)(-1 < sStack_56e) * sStack_56e;
            sStack_56c = (ushort)(-1 < sStack_56c) * sStack_56c;
            sStack_56a = (ushort)(-1 < sStack_56a) * sStack_56a;
            local_5a8 = (short)lVar11;
            sStack_5a6 = (short)((ulong)lVar11 >> 0x10);
            sStack_5a4 = (short)((ulong)lVar11 >> 0x20);
            sStack_5a2 = (short)((ulong)lVar11 >> 0x30);
            sStack_5a0 = (short)lVar12;
            sStack_59e = (short)((ulong)lVar12 >> 0x10);
            sStack_59c = (short)((ulong)lVar12 >> 0x20);
            sStack_59a = (short)((ulong)lVar12 >> 0x30);
            uVar41 = (ushort)(local_578 < local_5a8) * local_5a8 |
                     (ushort)(local_578 >= local_5a8) * local_578;
            uVar44 = (ushort)(sStack_576 < sStack_5a6) * sStack_5a6 |
                     (ushort)(sStack_576 >= sStack_5a6) * sStack_576;
            uVar45 = (ushort)(sStack_574 < sStack_5a4) * sStack_5a4 |
                     (ushort)(sStack_574 >= sStack_5a4) * sStack_574;
            uVar46 = (ushort)(sStack_572 < sStack_5a2) * sStack_5a2 |
                     (ushort)(sStack_572 >= sStack_5a2) * sStack_572;
            uVar47 = (ushort)(sStack_570 < sStack_5a0) * sStack_5a0 |
                     (ushort)(sStack_570 >= sStack_5a0) * sStack_570;
            uVar48 = (ushort)(sStack_56e < sStack_59e) * sStack_59e |
                     (ushort)(sStack_56e >= sStack_59e) * sStack_56e;
            uVar49 = (ushort)(sStack_56c < sStack_59c) * sStack_59c |
                     (ushort)(sStack_56c >= sStack_59c) * sStack_56c;
            uVar50 = (ushort)(sStack_56a < sStack_59a) * sStack_59a |
                     (ushort)(sStack_56a >= sStack_59a) * sStack_56a;
            local_5c8 = (short)vF_ext[1];
            sStack_5c6 = vF_ext[1]._2_2_;
            sStack_5c4 = vF_ext[1]._4_2_;
            sStack_5c2 = vF_ext[1]._6_2_;
            sStack_5c0 = (short)vF_ext[2];
            sStack_5be = vF_ext[2]._2_2_;
            sStack_5bc = vF_ext[2]._4_2_;
            sStack_5ba = vF_ext[2]._6_2_;
            uVar41 = (ushort)((short)uVar41 < local_5c8) * local_5c8 |
                     ((short)uVar41 >= local_5c8) * uVar41;
            uVar44 = (ushort)((short)uVar44 < sStack_5c6) * sStack_5c6 |
                     ((short)uVar44 >= sStack_5c6) * uVar44;
            uVar45 = (ushort)((short)uVar45 < sStack_5c4) * sStack_5c4 |
                     ((short)uVar45 >= sStack_5c4) * uVar45;
            uVar46 = (ushort)((short)uVar46 < sStack_5c2) * sStack_5c2 |
                     ((short)uVar46 >= sStack_5c2) * uVar46;
            uVar47 = (ushort)((short)uVar47 < sStack_5c0) * sStack_5c0 |
                     ((short)uVar47 >= sStack_5c0) * uVar47;
            uVar48 = (ushort)((short)uVar48 < sStack_5be) * sStack_5be |
                     ((short)uVar48 >= sStack_5be) * uVar48;
            uVar49 = (ushort)((short)uVar49 < sStack_5bc) * sStack_5bc |
                     ((short)uVar49 >= sStack_5bc) * uVar49;
            uVar50 = (ushort)((short)uVar50 < sStack_5ba) * sStack_5ba |
                     ((short)uVar50 >= sStack_5ba) * uVar50;
            vH_dag[1]._0_4_ = CONCAT22(uVar44,uVar41);
            vH_dag[1]._0_6_ = CONCAT24(uVar45,(undefined4)vH_dag[1]);
            vH_dag[1] = CONCAT26(uVar46,(undefined6)vH_dag[1]);
            vH[0]._0_4_ = CONCAT22(uVar48,uVar47);
            vH[0]._0_6_ = CONCAT24(uVar49,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar50,(undefined6)vH[0]);
            pvHLoad[k][0] = vH_dag[1];
            pvHLoad[k][1] = vH[0];
            palVar39 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_06[0] = (ulong)(uint)k;
            vH_05[0] = (ulong)(uint)end_query;
            alVar51 = arr_load(palVar39,k,a,end_query);
            b_00[0] = alVar51[1];
            a_00[1] = vH_06[0];
            a_00[0] = (longlong)palVar39;
            b_00[1] = vH_05[0];
            mask[1] = in_R9;
            mask[0] = lVar40;
            alVar51 = _mm_blendv_epi8_rpl(a_00,b_00,mask);
            b_01[0] = alVar51[1];
            a_01[1] = vH_06[0];
            a_01[0] = (longlong)palVar39;
            b_01[1] = vH_05[0];
            mask_00[1] = in_R9;
            mask_00[0] = lVar40;
            alVar51 = _mm_blendv_epi8_rpl(a_01,b_01,mask_00);
            b_02[0] = alVar51[1];
            a_02[1] = vH_06[0];
            a_02[0] = (longlong)palVar39;
            b_02[1] = vH_05[0];
            mask_01[1] = in_R9;
            mask_01[0] = lVar40;
            _mm_blendv_epi8_rpl(a_02,b_02,mask_01);
            ptr[k][0] = extraout_XMM0_Qa;
            ptr[k][1] = extraout_XMM0_Qb;
            palVar39 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = a;
            vH_01[1]._4_4_ = 0;
            arr_store(palVar39,vH_01,end_query,(int32_t)lVar40,(int32_t)in_R9);
            local_5e8 = (short)vMaxHUnit[1];
            sStack_5e6 = (short)((ulong)vMaxHUnit[1] >> 0x10);
            sStack_5e4 = (short)((ulong)vMaxHUnit[1] >> 0x20);
            sStack_5e2 = (short)((ulong)vMaxHUnit[1] >> 0x30);
            sStack_5e0 = (short)vMaxH[0];
            sStack_5de = (short)((ulong)vMaxH[0] >> 0x10);
            sStack_5dc = (short)((ulong)vMaxH[0] >> 0x20);
            sStack_5da = (short)((ulong)vMaxH[0] >> 0x30);
            vMaxHUnit[1]._0_4_ =
                 CONCAT22((ushort)((short)uVar44 < sStack_5e6) * sStack_5e6 |
                          ((short)uVar44 >= sStack_5e6) * uVar44,
                          (ushort)((short)uVar41 < local_5e8) * local_5e8 |
                          ((short)uVar41 >= local_5e8) * uVar41);
            vMaxHUnit[1]._0_6_ =
                 CONCAT24((ushort)((short)uVar45 < sStack_5e4) * sStack_5e4 |
                          ((short)uVar45 >= sStack_5e4) * uVar45,(undefined4)vMaxHUnit[1]);
            vMaxHUnit[1] = CONCAT26((ushort)((short)uVar46 < sStack_5e2) * sStack_5e2 |
                                    ((short)uVar46 >= sStack_5e2) * uVar46,(undefined6)vMaxHUnit[1])
            ;
            vMaxH[0]._0_4_ =
                 CONCAT22((ushort)((short)uVar48 < sStack_5de) * sStack_5de |
                          ((short)uVar48 >= sStack_5de) * uVar48,
                          (ushort)((short)uVar47 < sStack_5e0) * sStack_5e0 |
                          ((short)uVar47 >= sStack_5e0) * uVar47);
            vMaxH[0]._0_6_ =
                 CONCAT24((ushort)((short)uVar49 < sStack_5dc) * sStack_5dc |
                          ((short)uVar49 >= sStack_5dc) * uVar49,(undefined4)vMaxH[0]);
            vMaxH[0] = CONCAT26((ushort)((short)uVar50 < sStack_5da) * sStack_5da |
                                ((short)uVar50 >= sStack_5da) * uVar50,(undefined6)vMaxH[0]);
            auVar23._8_8_ = vH[0];
            auVar23._0_8_ = vH_dag[1];
            auVar22._8_8_ = uVar28;
            auVar22._0_8_ = uVar27;
            auVar42 = psubsw(auVar23,auVar22);
            auVar21._8_8_ = uVar30;
            auVar21._0_8_ = uVar29;
            auVar43 = psubsw((undefined1  [16])alVar52,auVar21);
            local_5f8 = auVar42._0_2_;
            sStack_5f6 = auVar42._2_2_;
            sStack_5f4 = auVar42._4_2_;
            sStack_5f2 = auVar42._6_2_;
            sStack_5f0 = auVar42._8_2_;
            sStack_5ee = auVar42._10_2_;
            sStack_5ec = auVar42._12_2_;
            sStack_5ea = auVar42._14_2_;
            local_608 = auVar43._0_2_;
            sStack_606 = auVar43._2_2_;
            sStack_604 = auVar43._4_2_;
            sStack_602 = auVar43._6_2_;
            sStack_600 = auVar43._8_2_;
            sStack_5fe = auVar43._10_2_;
            sStack_5fc = auVar43._12_2_;
            sStack_5fa = auVar43._14_2_;
            vE_ext[1] = CONCAT26((ushort)(sStack_5f2 < sStack_602) * sStack_602 |
                                 (ushort)(sStack_5f2 >= sStack_602) * sStack_5f2,
                                 CONCAT24((ushort)(sStack_5f4 < sStack_604) * sStack_604 |
                                          (ushort)(sStack_5f4 >= sStack_604) * sStack_5f4,
                                          CONCAT22((ushort)(sStack_5f6 < sStack_606) * sStack_606 |
                                                   (ushort)(sStack_5f6 >= sStack_606) * sStack_5f6,
                                                   (ushort)(local_5f8 < local_608) * local_608 |
                                                   (ushort)(local_5f8 >= local_608) * local_5f8)));
            vE[0] = CONCAT26((ushort)(sStack_5ea < sStack_5fa) * sStack_5fa |
                             (ushort)(sStack_5ea >= sStack_5fa) * sStack_5ea,
                             CONCAT24((ushort)(sStack_5ec < sStack_5fc) * sStack_5fc |
                                      (ushort)(sStack_5ec >= sStack_5fc) * sStack_5ec,
                                      CONCAT22((ushort)(sStack_5ee < sStack_5fe) * sStack_5fe |
                                               (ushort)(sStack_5ee >= sStack_5fe) * sStack_5ee,
                                               (ushort)(sStack_5f0 < sStack_600) * sStack_600 |
                                               (ushort)(sStack_5f0 >= sStack_600) * sStack_5f0)));
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            auVar20._8_8_ = uVar30;
            auVar20._0_8_ = uVar29;
            auVar42 = psubsw((undefined1  [16])palVar32[k],auVar20);
            local_628 = auVar42._0_2_;
            sStack_626 = auVar42._2_2_;
            sStack_624 = auVar42._4_2_;
            sStack_622 = auVar42._6_2_;
            sStack_620 = auVar42._8_2_;
            sStack_61e = auVar42._10_2_;
            sStack_61c = auVar42._12_2_;
            sStack_61a = auVar42._14_2_;
            vEa_ext[1] = CONCAT26((ushort)(sStack_5f2 < sStack_622) * sStack_622 |
                                  (ushort)(sStack_5f2 >= sStack_622) * sStack_5f2,
                                  CONCAT24((ushort)(sStack_5f4 < sStack_624) * sStack_624 |
                                           (ushort)(sStack_5f4 >= sStack_624) * sStack_5f4,
                                           CONCAT22((ushort)(sStack_5f6 < sStack_626) * sStack_626 |
                                                    (ushort)(sStack_5f6 >= sStack_626) * sStack_5f6,
                                                    (ushort)(local_5f8 < local_628) * local_628 |
                                                    (ushort)(local_5f8 >= local_628) * local_5f8)));
            vEa[0] = CONCAT26((ushort)(sStack_5ea < sStack_61a) * sStack_61a |
                              (ushort)(sStack_5ea >= sStack_61a) * sStack_5ea,
                              CONCAT24((ushort)(sStack_5ec < sStack_61c) * sStack_61c |
                                       (ushort)(sStack_5ec >= sStack_61c) * sStack_5ec,
                                       CONCAT22((ushort)(sStack_5ee < sStack_61e) * sStack_61e |
                                                (ushort)(sStack_5ee >= sStack_61e) * sStack_5ee,
                                                (ushort)(sStack_5f0 < sStack_620) * sStack_620 |
                                                (ushort)(sStack_5f0 >= sStack_620) * sStack_5f0)));
            b_03[1] = (long)k * 0x10;
            palVar36 = palVar31 + k;
            (*palVar36)[0] = vEa_ext[1];
            (*palVar36)[1] = vEa[0];
            vH_03[0] = vH_01[0];
            if (end_query + 1 < s2Len) {
              a_03[1] = vH_01[0];
              a_03[0] = (longlong)palVar39;
              b_03[0] = extraout_RDX_02;
              mask_02[1] = in_R9;
              mask_02[0] = lVar40;
              _mm_blendv_epi8_rpl(a_03,b_03,mask_02);
              palVar39 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_02[0] = (ulong)(uint)k;
              vH_02[1]._0_4_ = a;
              vH_02[1]._4_4_ = 0;
              arr_store(palVar39,vH_02,end_query + 1,(int32_t)lVar40,(int32_t)in_R9);
              vH_03[0] = vH_02[0];
            }
            auVar19._8_8_ = uVar30;
            auVar19._0_8_ = uVar29;
            auVar42 = psubsw(stack0xfffffffffffff548,auVar19);
            sVar3 = auVar42._0_2_;
            sVar4 = auVar42._2_2_;
            sVar5 = auVar42._4_2_;
            sVar6 = auVar42._6_2_;
            sVar7 = auVar42._8_2_;
            sVar8 = auVar42._10_2_;
            sVar9 = auVar42._12_2_;
            sVar10 = auVar42._14_2_;
            vF_ext[1] = CONCAT26((ushort)(sStack_5f2 < sVar6) * sVar6 |
                                 (ushort)(sStack_5f2 >= sVar6) * sStack_5f2,
                                 CONCAT24((ushort)(sStack_5f4 < sVar5) * sVar5 |
                                          (ushort)(sStack_5f4 >= sVar5) * sStack_5f4,
                                          CONCAT22((ushort)(sStack_5f6 < sVar4) * sVar4 |
                                                   (ushort)(sStack_5f6 >= sVar4) * sStack_5f6,
                                                   (ushort)(local_5f8 < sVar3) * sVar3 |
                                                   (ushort)(local_5f8 >= sVar3) * local_5f8)));
            vF[0]._0_2_ = (ushort)(sStack_5f0 < sVar7) * sVar7 |
                          (ushort)(sStack_5f0 >= sVar7) * sStack_5f0;
            vF[0]._2_2_ = (ushort)(sStack_5ee < sVar8) * sVar8 |
                          (ushort)(sStack_5ee >= sVar8) * sStack_5ee;
            vF[0]._4_2_ = (ushort)(sStack_5ec < sVar9) * sVar9 |
                          (ushort)(sStack_5ec >= sVar9) * sStack_5ec;
            vF[0]._6_2_ = (ushort)(sStack_5ea < sVar10) * sVar10 |
                          (ushort)(sStack_5ea >= sVar10) * sStack_5ea;
            if (k + 1 < a) {
              palVar39 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_06[0] = (ulong)(k + 1U);
              vH_05[0] = (ulong)(uint)end_query;
              alVar52 = arr_load(palVar39,k + 1U,a,end_query);
              b_04[0] = alVar52[1];
              a_04[1] = vH_06[0];
              a_04[0] = (longlong)palVar39;
              b_04[1] = vH_05[0];
              mask_03[1] = in_R9;
              mask_03[0] = lVar40;
              _mm_blendv_epi8_rpl(a_04,b_04,mask_03);
              palVar39 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_03[0] = (ulong)(k + 1);
              vH_03[1]._0_4_ = a;
              vH_03[1]._4_4_ = 0;
              arr_store(palVar39,vH_03,end_query,(int32_t)lVar40,(int32_t)in_R9);
            }
            vH_dag[1] = palVar33[k][0];
            vH[0] = palVar33[k][1];
            k = k + 1;
            vH_05[0] = vH_03[0];
          }
          vFa_ext[1] = vF_ext[1];
          vFa[0] = vF[0];
          for (end_ref = 0; end_ref < 8; end_ref = end_ref + 1) {
            vH_06[0] = palVar33[a + -1][0];
            vHp[0] = palVar33[a + -1][1] << 0x10 | vH_06[0] >> 0x30;
            vTAll_2[1] = vH_06[0] << 0x10;
            vF[0] = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            vF_ext[1] = vF_ext[1] << 0x10 | (ulong)(ushort)-(short)i;
            vFa[0] = vFa[0] << 0x10 | (ulong)vFa_ext[1] >> 0x30;
            vFa_ext[1] = vFa_ext[1] << 0x10 | (ulong)(ushort)-(short)i;
            for (k = 0; k < a; k = k + 1) {
              lVar11 = pvHLoad[k][0];
              lVar12 = pvHLoad[k][1];
              local_658 = (short)lVar11;
              sStack_656 = (short)((ulong)lVar11 >> 0x10);
              sStack_654 = (short)((ulong)lVar11 >> 0x20);
              sStack_652 = (short)((ulong)lVar11 >> 0x30);
              sStack_650 = (short)lVar12;
              sStack_64e = (short)((ulong)lVar12 >> 0x10);
              sStack_64c = (short)((ulong)lVar12 >> 0x20);
              sStack_64a = (short)((ulong)lVar12 >> 0x30);
              local_668 = (short)vF_ext[1];
              sStack_666 = vF_ext[1]._2_2_;
              sStack_664 = vF_ext[1]._4_2_;
              sStack_662 = vF_ext[1]._6_2_;
              sStack_660 = (short)vF_ext[2];
              sStack_65e = vF_ext[2]._2_2_;
              sStack_65c = vF_ext[2]._4_2_;
              sStack_65a = vF_ext[2]._6_2_;
              uVar41 = (ushort)(local_658 < local_668) * local_668 |
                       (ushort)(local_658 >= local_668) * local_658;
              uVar44 = (ushort)(sStack_656 < sStack_666) * sStack_666 |
                       (ushort)(sStack_656 >= sStack_666) * sStack_656;
              uVar45 = (ushort)(sStack_654 < sStack_664) * sStack_664 |
                       (ushort)(sStack_654 >= sStack_664) * sStack_654;
              uVar46 = (ushort)(sStack_652 < sStack_662) * sStack_662 |
                       (ushort)(sStack_652 >= sStack_662) * sStack_652;
              uVar47 = (ushort)(sStack_650 < sStack_660) * sStack_660 |
                       (ushort)(sStack_650 >= sStack_660) * sStack_650;
              uVar48 = (ushort)(sStack_64e < sStack_65e) * sStack_65e |
                       (ushort)(sStack_64e >= sStack_65e) * sStack_64e;
              uVar49 = (ushort)(sStack_64c < sStack_65c) * sStack_65c |
                       (ushort)(sStack_64c >= sStack_65c) * sStack_64c;
              uVar50 = (ushort)(sStack_64a < sStack_65a) * sStack_65a |
                       (ushort)(sStack_64a >= sStack_65a) * sStack_64a;
              vH_dag[1]._0_4_ = CONCAT22(uVar44,uVar41);
              vH_dag[1]._0_6_ = CONCAT24(uVar45,(undefined4)vH_dag[1]);
              vH_dag[1] = CONCAT26(uVar46,(undefined6)vH_dag[1]);
              vH[0]._0_4_ = CONCAT22(uVar48,uVar47);
              vH[0]._0_6_ = CONCAT24(uVar49,(undefined4)vH[0]);
              vH[0] = CONCAT26(uVar50,(undefined6)vH[0]);
              pvHLoad[k][0] = vH_dag[1];
              pvHLoad[k][1] = vH[0];
              paddsw((undefined1  [16])stack0xfffffffffffff3f8,
                     *(undefined1 (*) [16])((long)pvVar2 + (long)k * 0x10 + (long)iVar38 * 0x10));
              palVar39 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_05[0] = (ulong)(uint)k;
              alVar52 = arr_load(palVar39,k,a,end_query);
              b_05[0] = alVar52[1];
              b_05[1] = (long)k * 0x10;
              a_05[1] = vH_05[0];
              a_05[0] = (longlong)palVar39;
              mask_04[1] = in_R9;
              mask_04[0] = lVar40;
              _mm_blendv_epi8_rpl(a_05,b_05,mask_04);
              ptr[k][0] = extraout_XMM0_Qa_00;
              ptr[k][1] = extraout_XMM0_Qb_00;
              vH_04[0] = (ulong)(uint)k;
              vH_04[1]._0_4_ = a;
              vH_04[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_04,end_query,(int32_t)lVar40,(int32_t)in_R9);
              local_6a8 = (short)vMaxHUnit[1];
              sStack_6a6 = (short)((ulong)vMaxHUnit[1] >> 0x10);
              sStack_6a4 = (short)((ulong)vMaxHUnit[1] >> 0x20);
              sStack_6a2 = (short)((ulong)vMaxHUnit[1] >> 0x30);
              sStack_6a0 = (short)vMaxH[0];
              sStack_69e = (short)((ulong)vMaxH[0] >> 0x10);
              sStack_69c = (short)((ulong)vMaxH[0] >> 0x20);
              sStack_69a = (short)((ulong)vMaxH[0] >> 0x30);
              vMaxHUnit[1]._0_4_ =
                   CONCAT22((ushort)((short)uVar44 < sStack_6a6) * sStack_6a6 |
                            ((short)uVar44 >= sStack_6a6) * uVar44,
                            (ushort)((short)uVar41 < local_6a8) * local_6a8 |
                            ((short)uVar41 >= local_6a8) * uVar41);
              vMaxHUnit[1]._0_6_ =
                   CONCAT24((ushort)((short)uVar45 < sStack_6a4) * sStack_6a4 |
                            ((short)uVar45 >= sStack_6a4) * uVar45,(undefined4)vMaxHUnit[1]);
              vMaxHUnit[1] = CONCAT26((ushort)((short)uVar46 < sStack_6a2) * sStack_6a2 |
                                      ((short)uVar46 >= sStack_6a2) * uVar46,
                                      (undefined6)vMaxHUnit[1]);
              vMaxH[0]._0_4_ =
                   CONCAT22((ushort)((short)uVar48 < sStack_69e) * sStack_69e |
                            ((short)uVar48 >= sStack_69e) * uVar48,
                            (ushort)((short)uVar47 < sStack_6a0) * sStack_6a0 |
                            ((short)uVar47 >= sStack_6a0) * uVar47);
              vMaxH[0]._0_6_ =
                   CONCAT24((ushort)((short)uVar49 < sStack_69c) * sStack_69c |
                            ((short)uVar49 >= sStack_69c) * uVar49,(undefined4)vMaxH[0]);
              vMaxH[0] = CONCAT26((ushort)((short)uVar50 < sStack_69a) * sStack_69a |
                                  ((short)uVar50 >= sStack_69a) * uVar50,(undefined6)vMaxH[0]);
              palVar39 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_06[0] = (ulong)(uint)k;
              vH_05[0] = (ulong)(uint)end_query;
              alVar52 = arr_load(palVar39,k,a,end_query);
              b_06[0] = alVar52[1];
              a_06[1] = vH_06[0];
              a_06[0] = (longlong)palVar39;
              b_06[1] = vH_05[0];
              mask_05[1] = in_R9;
              mask_05[0] = lVar40;
              _mm_blendv_epi8_rpl(a_06,b_06,mask_05);
              palVar39 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_05[0] = (ulong)(uint)k;
              vH_05[1]._0_4_ = a;
              vH_05[1]._4_4_ = 0;
              arr_store(palVar39,vH_05,end_query,(int32_t)lVar40,(int32_t)in_R9);
              auVar18._8_8_ = vH[0];
              auVar18._0_8_ = vH_dag[1];
              auVar17._8_8_ = uVar28;
              auVar17._0_8_ = uVar27;
              auVar42 = psubsw(auVar18,auVar17);
              auVar16._8_8_ = uVar30;
              auVar16._0_8_ = uVar29;
              register0x00001200 = psubsw(stack0xfffffffffffff548,auVar16);
              auVar43._8_8_ = uVar30;
              auVar43._0_8_ = uVar29;
              auVar43 = psubsw((undefined1  [16])palVar32[k],auVar43);
              local_6b8 = auVar42._0_2_;
              sStack_6b6 = auVar42._2_2_;
              sStack_6b4 = auVar42._4_2_;
              sStack_6b2 = auVar42._6_2_;
              sStack_6b0 = auVar42._8_2_;
              sStack_6ae = auVar42._10_2_;
              sStack_6ac = auVar42._12_2_;
              sStack_6aa = auVar42._14_2_;
              local_6c8 = auVar43._0_2_;
              sStack_6c6 = auVar43._2_2_;
              sStack_6c4 = auVar43._4_2_;
              sStack_6c2 = auVar43._6_2_;
              sStack_6c0 = auVar43._8_2_;
              sStack_6be = auVar43._10_2_;
              sStack_6bc = auVar43._12_2_;
              sStack_6ba = auVar43._14_2_;
              vEa_ext_1[1] = CONCAT26((ushort)(sStack_6b2 < sStack_6c2) * sStack_6c2 |
                                      (ushort)(sStack_6b2 >= sStack_6c2) * sStack_6b2,
                                      CONCAT24((ushort)(sStack_6b4 < sStack_6c4) * sStack_6c4 |
                                               (ushort)(sStack_6b4 >= sStack_6c4) * sStack_6b4,
                                               CONCAT22((ushort)(sStack_6b6 < sStack_6c6) *
                                                        sStack_6c6 |
                                                        (ushort)(sStack_6b6 >= sStack_6c6) *
                                                        sStack_6b6,
                                                        (ushort)(local_6b8 < local_6c8) * local_6c8
                                                        | (ushort)(local_6b8 >= local_6c8) *
                                                          local_6b8)));
              vEa_1[0] = CONCAT26((ushort)(sStack_6aa < sStack_6ba) * sStack_6ba |
                                  (ushort)(sStack_6aa >= sStack_6ba) * sStack_6aa,
                                  CONCAT24((ushort)(sStack_6ac < sStack_6bc) * sStack_6bc |
                                           (ushort)(sStack_6ac >= sStack_6bc) * sStack_6ac,
                                           CONCAT22((ushort)(sStack_6ae < sStack_6be) * sStack_6be |
                                                    (ushort)(sStack_6ae >= sStack_6be) * sStack_6ae,
                                                    (ushort)(sStack_6b0 < sStack_6c0) * sStack_6c0 |
                                                    (ushort)(sStack_6b0 >= sStack_6c0) * sStack_6b0)
                                          ));
              b_07[1] = (long)k * 0x10;
              palVar36 = palVar31 + k;
              (*palVar36)[0] = vEa_ext_1[1];
              (*palVar36)[1] = vEa_1[0];
              if (end_query + 1 < s2Len) {
                a_07[1] = vH_05[0];
                a_07[0] = (longlong)palVar39;
                b_07[0] = extraout_RDX_03;
                mask_06[1] = in_R9;
                mask_06[0] = lVar40;
                _mm_blendv_epi8_rpl(a_07,b_07,mask_06);
                palVar39 = (__m128i *)
                           ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)
                           ->rowcols->score_row;
                vH_06[0] = (ulong)(uint)k;
                vH_06[1]._0_4_ = a;
                vH_06[1]._4_4_ = 0;
                arr_store(palVar39,vH_06,end_query + 1,(int32_t)lVar40,(int32_t)in_R9);
                vH_05[0] = vH_06[0];
              }
              local_2f8 = (short)vF_ext[1];
              sStack_2f6 = vF_ext[1]._2_2_;
              sStack_2f4 = vF_ext[1]._4_2_;
              sStack_2f2 = vF_ext[1]._6_2_;
              sStack_2f0 = (short)vF_ext[2];
              sStack_2ee = vF_ext[2]._2_2_;
              sStack_2ec = vF_ext[2]._4_2_;
              sStack_2ea = vF_ext[2]._6_2_;
              vH_06[0] = CONCAT26(-(ushort)(sStack_6aa < sStack_2ea),
                                  CONCAT24(-(ushort)(sStack_6ac < sStack_2ec),
                                           CONCAT22(-(ushort)(sStack_6ae < sStack_2ee),
                                                    -(ushort)(sStack_6b0 < sStack_2f0)))) |
                         CONCAT26(-(ushort)(sStack_2ea == sStack_6aa),
                                  CONCAT24(-(ushort)(sStack_2ec == sStack_6ac),
                                           CONCAT22(-(ushort)(sStack_2ee == sStack_6ae),
                                                    -(ushort)(sStack_2f0 == sStack_6b0))));
              auVar26._8_8_ = vH_06[0];
              auVar26._0_8_ =
                   CONCAT26(-(ushort)(sStack_6b2 < sStack_2f2),
                            CONCAT24(-(ushort)(sStack_6b4 < sStack_2f4),
                                     CONCAT22(-(ushort)(sStack_6b6 < sStack_2f6),
                                              -(ushort)(local_6b8 < local_2f8)))) |
                   CONCAT26(-(ushort)(sStack_2f2 == sStack_6b2),
                            CONCAT24(-(ushort)(sStack_2f4 == sStack_6b4),
                                     CONCAT22(-(ushort)(sStack_2f6 == sStack_6b6),
                                              -(ushort)(local_2f8 == local_6b8))));
              if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar26 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar26 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar26 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (vH_06[0] >> 7 & 1) == 0) && (vH_06[0] >> 0xf & 1) == 0) &&
                      (vH_06[0] >> 0x17 & 1) == 0) && (vH_06[0] >> 0x1f & 1) == 0) &&
                    (vH_06[0] >> 0x27 & 1) == 0) && (vH_06[0] >> 0x2f & 1) == 0) &&
                  (vH_06[0] >> 0x37 & 1) == 0) && -1 < (long)vH_06[0]) goto LAB_0087db5a;
              auVar15._8_8_ = vFa[0];
              auVar15._0_8_ = vFa_ext[1];
              auVar14._8_8_ = uVar30;
              auVar14._0_8_ = uVar29;
              auVar42 = psubsw(auVar15,auVar14);
              sVar3 = auVar42._0_2_;
              sVar4 = auVar42._2_2_;
              sVar5 = auVar42._4_2_;
              sVar6 = auVar42._6_2_;
              sVar7 = auVar42._8_2_;
              sVar8 = auVar42._10_2_;
              sVar9 = auVar42._12_2_;
              sVar10 = auVar42._14_2_;
              vFa_ext[1] = CONCAT26((ushort)(sStack_6b2 < sVar6) * sVar6 |
                                    (ushort)(sStack_6b2 >= sVar6) * sStack_6b2,
                                    CONCAT24((ushort)(sStack_6b4 < sVar5) * sVar5 |
                                             (ushort)(sStack_6b4 >= sVar5) * sStack_6b4,
                                             CONCAT22((ushort)(sStack_6b6 < sVar4) * sVar4 |
                                                      (ushort)(sStack_6b6 >= sVar4) * sStack_6b6,
                                                      (ushort)(local_6b8 < sVar3) * sVar3 |
                                                      (ushort)(local_6b8 >= sVar3) * local_6b8)));
              vFa[0] = CONCAT26((ushort)(sStack_6aa < sVar10) * sVar10 |
                                (ushort)(sStack_6aa >= sVar10) * sStack_6aa,
                                CONCAT24((ushort)(sStack_6ac < sVar9) * sVar9 |
                                         (ushort)(sStack_6ac >= sVar9) * sStack_6ac,
                                         CONCAT22((ushort)(sStack_6ae < sVar8) * sVar8 |
                                                  (ushort)(sStack_6ae >= sVar8) * sStack_6ae,
                                                  (ushort)(sStack_6b0 < sVar7) * sVar7 |
                                                  (ushort)(sStack_6b0 >= sVar7) * sStack_6b0)));
              unique0x1000396d = palVar33[k];
            }
          }
LAB_0087db5a:
          local_318 = (short)vMaxHUnit[1];
          sStack_316 = (short)((ulong)vMaxHUnit[1] >> 0x10);
          sStack_314 = (short)((ulong)vMaxHUnit[1] >> 0x20);
          sStack_312 = (short)((ulong)vMaxHUnit[1] >> 0x30);
          sStack_310 = (short)vMaxH[0];
          sStack_30e = (short)((ulong)vMaxH[0] >> 0x10);
          sStack_30c = (short)((ulong)vMaxH[0] >> 0x20);
          sStack_30a = (short)((ulong)vMaxH[0] >> 0x30);
          local_328 = (short)uStack_9c8;
          sStack_326 = (short)((ulong)uStack_9c8 >> 0x10);
          sStack_324 = (short)((ulong)uStack_9c8 >> 0x20);
          sStack_322 = (short)((ulong)uStack_9c8 >> 0x30);
          sStack_320 = (short)vMaxHUnit[0];
          sStack_31e = (short)((ulong)vMaxHUnit[0] >> 0x10);
          sStack_31c = (short)((ulong)vMaxHUnit[0] >> 0x20);
          sStack_31a = (short)((ulong)vMaxHUnit[0] >> 0x30);
          uVar41 = -(ushort)(sStack_320 < sStack_310);
          uVar44 = -(ushort)(sStack_31e < sStack_30e);
          uVar45 = -(ushort)(sStack_31a < sStack_30a);
          auVar25._2_2_ = -(ushort)(sStack_326 < sStack_316);
          auVar25._0_2_ = -(ushort)(local_328 < local_318);
          auVar25._4_2_ = -(ushort)(sStack_324 < sStack_314);
          auVar25._6_2_ = -(ushort)(sStack_322 < sStack_312);
          iVar13 = CONCAT24(-(ushort)(sStack_31c < sStack_30c),CONCAT22(uVar44,uVar41));
          auVar25._14_2_ = uVar45;
          auVar25._8_6_ = iVar13;
          if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar41 & 0x80) != 0) || (uVar41 & 0x8000) != 0) || (uVar44 & 0x80) != 0) ||
                 (uVar44 & 0x8000) != 0) || (-(ushort)(sStack_31c < sStack_30c) & 0x80) != 0) ||
               iVar13 != 0) || (uVar45 >> 7 & 1) != 0) || sStack_31a < sStack_30a) {
            a_08[1] = vH_05[0];
            a_08[0] = (longlong)palVar39;
            local_99a = _mm_hmax_epi16_rpl(a_08);
            if ((short)((short)iVar34 + 1U ^ 0x7fff) < local_99a) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            uStack_9c8 = CONCAT26(local_99a,CONCAT24(local_99a,CONCAT22(local_99a,local_99a)));
            vMaxHUnit[0] = CONCAT26(local_99a,CONCAT24(local_99a,CONCAT22(local_99a,local_99a)));
            local_910 = end_query;
          }
        }
        lVar40 = vGapO[1];
        if (local_99a == 0x7fff) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar34 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar34 == 0) {
          if (local_910 == end_query + -1) {
            vGapO[1] = (longlong)pvHLoad;
            pvHLoad = (__m128i *)lVar40;
          }
          else if (local_910 == end_query + -2) {
            vGapO[1] = (longlong)pvE;
            pvE = (__m128i *)lVar40;
          }
          _temp = (short *)vGapO[1];
          s1Len = iVar35 + -1;
          for (k = 0; k < a * 8; k = k + 1) {
            if ((*_temp == local_99a) && (iVar35 = k / 8 + (k % 8) * a, iVar35 < s1Len)) {
              s1Len = iVar35;
            }
            _temp = _temp + 1;
          }
        }
        else {
          local_99a = 0;
          s1Len = 0;
          local_910 = 0;
        }
        *(int *)&profile_local->s1 = (int)local_99a;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_910;
        parasail_free((void *)vGapO[1]);
        parasail_free(ptr);
        parasail_free(pvHT);
        parasail_free(pvEaLoad);
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    vTZero = _mm_set1_epi16(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi16(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi16(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_subs_epi16(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi16(vH_dag, vZero);
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi16(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi16(vH, vMaxH);
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi16(vHp, vZero);
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi16(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}